

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O0

void __thiscall wasm::DataFlow::Printer::print(Printer *this,Node *node)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  Node *pNVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  Type type;
  size_type sVar7;
  Node *child;
  uint local_34;
  size_type sStack_30;
  Index i;
  size_type size;
  Node *block;
  Node *local_18;
  Node *node_local;
  Printer *this_local;
  
  local_18 = node;
  node_local = (Node *)this;
  local_18 = getMaybeReplaced(this,node);
  if (local_18 != (Node *)0x0) {
    switch(local_18->type) {
    case Var:
      poVar5 = std::operator<<((ostream *)&std::cout,"%");
      pmVar6 = std::
               unordered_map<wasm::DataFlow::Node_*,_unsigned_int,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>_>
               ::operator[](&this->indexing,&local_18);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
      poVar5 = std::operator<<(poVar5,":");
      block = (Node *)(local_18->field_1).wasmType.id;
      poVar5 = wasm::operator<<(poVar5,(Type)block);
      std::operator<<(poVar5," = var");
      break;
    case Expr:
      iVar2 = debug();
      if (iVar2 != 0) {
        std::operator<<((ostream *)&std::cout,"; ");
        poVar5 = std::operator<<((ostream *)&std::cout,(local_18->field_1).expr);
        std::operator<<(poVar5,'\n');
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"%");
      pmVar6 = std::
               unordered_map<wasm::DataFlow::Node_*,_unsigned_int,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>_>
               ::operator[](&this->indexing,&local_18);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
      std::operator<<(poVar5," = ");
      printExpression(this,local_18);
      break;
    case Phi:
      size = (size_type)Node::getValue(local_18,0);
      sStack_30 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::size
                            (&((Node *)size)->values);
      poVar5 = std::operator<<((ostream *)&std::cout,"%");
      pmVar6 = std::
               unordered_map<wasm::DataFlow::Node_*,_unsigned_int,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>_>
               ::operator[](&this->indexing,&local_18);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
      poVar5 = std::operator<<(poVar5," = phi %");
      pmVar6 = std::
               unordered_map<wasm::DataFlow::Node_*,_unsigned_int,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>_>
               ::operator[](&this->indexing,(key_type *)&size);
      std::ostream::operator<<(poVar5,*pmVar6);
      for (local_34 = 1; (ulong)local_34 < sStack_30 + 1; local_34 = local_34 + 1) {
        std::operator<<((ostream *)&std::cout,", ");
        pNVar4 = Node::getValue(local_18,local_34);
        printInternal(this,pNVar4);
      }
      break;
    case Cond:
      poVar5 = std::operator<<((ostream *)&std::cout,"blockpc %");
      child = Node::getValue(local_18,0);
      pmVar6 = std::
               unordered_map<wasm::DataFlow::Node_*,_unsigned_int,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>_>
               ::operator[](&this->indexing,&child);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
      poVar5 = std::operator<<(poVar5,' ');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(local_18->field_1).index);
      std::operator<<(poVar5,' ');
      pNVar4 = Node::getValue(local_18,1);
      printInternal(this,pNVar4);
      std::operator<<((ostream *)&std::cout," 1:i1");
      break;
    case Block:
      poVar5 = std::operator<<((ostream *)&std::cout,"%");
      pmVar6 = std::
               unordered_map<wasm::DataFlow::Node_*,_unsigned_int,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>_>
               ::operator[](&this->indexing,&local_18);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
      poVar5 = std::operator<<(poVar5," = block ");
      sVar3 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::size
                        (&local_18->values);
      std::ostream::operator<<(poVar5,sVar3);
      break;
    case Zext:
      pNVar4 = Node::getValue(local_18,0);
      poVar5 = std::operator<<((ostream *)&std::cout,"%");
      pmVar6 = std::
               unordered_map<wasm::DataFlow::Node_*,_unsigned_int,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>_>
               ::operator[](&this->indexing,&local_18);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar6);
      poVar5 = std::operator<<(poVar5,':');
      type = Node::getWasmType(pNVar4);
      wasm::operator<<(poVar5,type);
      std::operator<<((ostream *)&std::cout," = zext ");
      printInternal(this,pNVar4);
      break;
    case Bad:
      handle_unreachable("!!!BAD!!!",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                         ,0x1f6);
    default:
      handle_unreachable("unexpted type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                         ,0x1f9);
    }
    bVar1 = Node::isExpr(local_18);
    if ((((bVar1) || (bVar1 = Node::isPhi(local_18), bVar1)) &&
        (local_18->origin != this->trace->toInfer->origin)) &&
       (sVar7 = std::
                unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                ::count(&this->trace->hasExternalUses,&local_18), sVar7 != 0)) {
      std::operator<<((ostream *)&std::cout," (hasExternalUses)");
      this->printedHasExternalUses = true;
    }
    std::operator<<((ostream *)&std::cout,'\n');
    iVar2 = debug();
    if ((iVar2 != 0) &&
       ((bVar1 = Node::isExpr(local_18), bVar1 || (bVar1 = Node::isPhi(local_18), bVar1)))) {
      warnOnSuspiciousValues(this,local_18);
    }
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                ,0x1c9,"void wasm::DataFlow::Printer::print(Node *)");
}

Assistant:

void print(Node* node) {
    // The node may have been replaced during trace building, if so then
    // print the proper replacement.
    node = getMaybeReplaced(node);
    assert(node);
    switch (node->type) {
      case Node::Type::Var: {
        std::cout << "%" << indexing[node] << ":" << node->wasmType << " = var";
        break; // nothing more to add
      }
      case Node::Type::Expr: {
        if (debug()) {
          std::cout << "; ";
          std::cout << *node->expr << '\n';
        }
        std::cout << "%" << indexing[node] << " = ";
        printExpression(node);
        break;
      }
      case Node::Type::Phi: {
        auto* block = node->getValue(0);
        auto size = block->values.size();
        std::cout << "%" << indexing[node] << " = phi %" << indexing[block];
        for (Index i = 1; i < size + 1; i++) {
          std::cout << ", ";
          printInternal(node->getValue(i));
        }
        break;
      }
      case Node::Type::Cond: {
        std::cout << "blockpc %" << indexing[node->getValue(0)] << ' '
                  << node->index << ' ';
        printInternal(node->getValue(1));
        std::cout << " 1:i1";
        break;
      }
      case Node::Type::Block: {
        std::cout << "%" << indexing[node] << " = block "
                  << node->values.size();
        break;
      }
      case Node::Type::Zext: {
        auto* child = node->getValue(0);
        std::cout << "%" << indexing[node] << ':' << child->getWasmType();
        std::cout << " = zext ";
        printInternal(child);
        break;
      }
      case Node::Type::Bad: {
        WASM_UNREACHABLE("!!!BAD!!!");
      }
      default:
        WASM_UNREACHABLE("unexpted type");
    }
    if (node->isExpr() || node->isPhi()) {
      if (node->origin != trace.toInfer->origin &&
          trace.hasExternalUses.count(node) > 0) {
        std::cout << " (hasExternalUses)";
        printedHasExternalUses = true;
      }
    }
    std::cout << '\n';
    if (debug() && (node->isExpr() || node->isPhi())) {
      warnOnSuspiciousValues(node);
    }
  }